

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_teamcity.hpp
# Opt level: O1

bool __thiscall
Catch::TeamCityReporter::assertionEnded(TeamCityReporter *this,AssertionStats *assertionStats)

{
  OfType OVar1;
  tuple<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  os;
  pointer pMVar2;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar3;
  size_t sVar4;
  ostream *poVar5;
  ulong uVar6;
  MessageInfo *messageInfo;
  pointer pMVar7;
  char *pcVar8;
  ReusableStringStream msg;
  string local_b0;
  string local_90;
  TeamCityReporter *local_70;
  string local_68;
  ReusableStringStream local_48;
  
  if ((((assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok) ||
     (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0))
  goto LAB_001457c3;
  local_48.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_00315d48;
  pSVar3 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar4 = StringStreams::add(&pSVar3->super_StringStreams);
  local_48.m_index = sVar4;
  pSVar3 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  os.
  super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       *(_Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&(pSVar3->super_StringStreams).m_streams.
            super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar4]._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  local_48.m_oss =
       (ostream *)
       os.
       super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if ((this->super_StreamingReporterBase<Catch::TeamCityReporter>).field_0x162 == '\0') {
    printSectionHeader(this,(ostream *)
                            os.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  (this->super_StreamingReporterBase<Catch::TeamCityReporter>).field_0x162 = 1;
  local_b0._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
  local_b0._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
  Catch::operator<<((ostream *)
                    os.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl,(SourceLineInfo *)&local_b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             os.
             super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,"\n",1);
  OVar1 = (assertionStats->assertionResult).m_resultData.resultType;
  uVar6 = (ulong)(uint)OVar1;
  if (OVar1 < ThrewException) {
    if (FailureBit < OVar1) {
      if (OVar1 == ExpressionFailed) {
        pcVar8 = "expression failed";
      }
      else {
        if (OVar1 != ExplicitFailure) {
          if (OVar1 == Exception) goto LAB_00145397;
          goto LAB_0014541c;
        }
        uVar6 = 0x10;
        pcVar8 = "explicit failure";
      }
      goto LAB_00145414;
    }
    if ((uint)OVar1 < 3) {
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_90);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_90.field_2._M_allocated_capacity,
                 "Internal error in TeamCity reporter",0x23);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_b0);
    }
    if ((OVar1 == Unknown) || (OVar1 == FailureBit)) {
LAB_00145397:
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_90);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_90.field_2._M_allocated_capacity,"Not implemented",0xf);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_b0);
    }
  }
  else {
    if (OVar1 == ThrewException) {
      uVar6 = 0x14;
      pcVar8 = "unexpected exception";
    }
    else if (OVar1 == DidntThrowException) {
      uVar6 = 0x2e;
      pcVar8 = "no exception was thrown where one was expected";
    }
    else {
      if (OVar1 != FatalErrorCondition) goto LAB_0014541c;
      uVar6 = 0x15;
      pcVar8 = "fatal error condition";
    }
LAB_00145414:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,pcVar8,uVar6);
  }
LAB_0014541c:
  if ((long)(assertionStats->infoMessages).
            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(assertionStats->infoMessages).
            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
            super__Vector_impl_data._M_start == 0x48) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl," with message:",0xe);
  }
  if (1 < (ulong)(((long)(assertionStats->infoMessages).
                         super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(assertionStats->infoMessages).
                         super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl," with messages:",0xf);
  }
  pMVar2 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar7 = (assertionStats->infoMessages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_start; local_70 = this, pMVar7 != pMVar2;
      pMVar7 = pMVar7 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,"\n  \"",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,(pMVar7->message)._M_dataplus._M_p,(pMVar7->message)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,"\"",1);
    this = local_70;
  }
  if ((assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,"\n  ",3);
    AssertionResult::getExpressionInMacro_abi_cxx11_(&local_b0,&assertionStats->assertionResult);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,"\nwith expansion:\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,"  ",2);
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_90,&assertionStats->assertionResult);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if ((((this->super_StreamingReporterBase<Catch::TeamCityReporter>).currentTestCaseInfo.
        super_Option<Catch::TestCaseInfo>.nullableValue)->properties & (MayFail|ShouldFail)) == None
     ) {
    poVar5 = (ostream *)(this->super_StreamingReporterBase<Catch::TeamCityReporter>).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"##teamcity[testFailed",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," name=\'",7);
    escape(&local_b0,
           &((this->super_StreamingReporterBase<Catch::TeamCityReporter>).currentTestCaseInfo.
             super_Option<Catch::TestCaseInfo>.nullableValue)->name);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," message=\'",10);
    std::__cxx11::stringbuf::str();
    escape(&local_90,&local_68);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]\n",2);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               os.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,"- failure ignore as test marked as \'ok to fail\'\n",0x30);
    poVar5 = (ostream *)(this->super_StreamingReporterBase<Catch::TeamCityReporter>).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"##teamcity[testIgnored",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," name=\'",7);
    escape(&local_b0,
           &((this->super_StreamingReporterBase<Catch::TeamCityReporter>).currentTestCaseInfo.
             super_Option<Catch::TestCaseInfo>.nullableValue)->name);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," message=\'",10);
    std::__cxx11::stringbuf::str();
    escape(&local_90,&local_68);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]\n",2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  ReusableStringStream::~ReusableStringStream(&local_48);
LAB_001457c3:
  std::ostream::flush();
  return true;
}

Assistant:

bool assertionEnded( AssertionStats const& assertionStats ) override {
            AssertionResult const& result = assertionStats.assertionResult;
            if( !result.isOk() ) {

                ReusableStringStream msg;
                if( !m_headerPrintedForThisSection )
                    printSectionHeader( msg.get() );
                m_headerPrintedForThisSection = true;

                msg << result.getSourceInfo() << "\n";

                switch( result.getResultType() ) {
                    case ResultWas::ExpressionFailed:
                        msg << "expression failed";
                        break;
                    case ResultWas::ThrewException:
                        msg << "unexpected exception";
                        break;
                    case ResultWas::FatalErrorCondition:
                        msg << "fatal error condition";
                        break;
                    case ResultWas::DidntThrowException:
                        msg << "no exception was thrown where one was expected";
                        break;
                    case ResultWas::ExplicitFailure:
                        msg << "explicit failure";
                        break;

                    // We shouldn't get here because of the isOk() test
                    case ResultWas::Ok:
                    case ResultWas::Info:
                    case ResultWas::Warning:
                        CATCH_ERROR( "Internal error in TeamCity reporter" );
                    // These cases are here to prevent compiler warnings
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        CATCH_ERROR( "Not implemented" );
                }
                if( assertionStats.infoMessages.size() == 1 )
                    msg << " with message:";
                if( assertionStats.infoMessages.size() > 1 )
                    msg << " with messages:";
                for( auto const& messageInfo : assertionStats.infoMessages )
                    msg << "\n  \"" << messageInfo.message << "\"";


                if( result.hasExpression() ) {
                    msg <<
                        "\n  " << result.getExpressionInMacro() << "\n"
                        "with expansion:\n" <<
                        "  " << result.getExpandedExpression() << "\n";
                }

                if( currentTestCaseInfo->okToFail() ) {
                    msg << "- failure ignore as test marked as 'ok to fail'\n";
                    stream << "##teamcity[testIgnored"
                           << " name='" << escape( currentTestCaseInfo->name )<< "'"
                           << " message='" << escape( msg.str() ) << "'"
                           << "]\n";
                }
                else {
                    stream << "##teamcity[testFailed"
                           << " name='" << escape( currentTestCaseInfo->name )<< "'"
                           << " message='" << escape( msg.str() ) << "'"
                           << "]\n";
                }
            }
            stream.flush();
            return true;
        }